

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O3

Vec_Int_t * Abc_NtkGetCiSatVarNums(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  
  pVVar5 = pNtk->vCis;
  iVar1 = pVVar5->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar2;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      Vec_IntPush(p,*(int *)((long)pVVar5->pArray[lVar4] + 0x40));
      lVar4 = lVar4 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vCiIds;
    Abc_Obj_t * pObj;
    int i;
    vCiIds = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vCiIds, (int)(ABC_PTRINT_T)pObj->pCopy );
    return vCiIds;
}